

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_parameters.cpp
# Opt level: O3

void __thiscall
AppParametersTest_multiword_value_eq_Test::TestBody(AppParametersTest_multiword_value_eq_Test *this)

{
  unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_> uVar1;
  byte bVar2;
  long lVar3;
  long *plVar4;
  object *poVar5;
  _Uninitialized<void_*,_true> _Var6;
  char *pcVar7;
  pointer *__ptr;
  bool bVar8;
  initializer_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>
  __l_00;
  map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
  expected_values;
  object obj;
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  expected_args;
  ArgWrapper<char> args;
  app_parameters parameters;
  long *local_290;
  less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
  local_288 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_280;
  undefined1 local_278 [8];
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_270;
  anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
  local_268;
  _Variadic_union<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  local_258;
  _Rb_tree<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
  local_218;
  undefined1 local_1e8 [64];
  AssertHelper local_1a8 [8];
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  local_1a0;
  ArgWrapper<char> local_188;
  app_parameters local_168 [336];
  
  ArgWrapper<char>::ArgWrapper<char_const*,char_const*,char_const*>
            (&local_188,"/path/to/exe","-key=valuePart1","valuePart2");
  uVar1._M_t.super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
  super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
  super__Head_base<0UL,_const_char_**,_false>._M_head_impl =
       local_188.m_argv._M_t.
       super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
       super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
       super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
  jessilib::app_parameters::default_stop_args();
  jessilib::app_parameters::app_parameters
            (local_168,
             (int)((ulong)((long)local_188.m_args.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_188.m_args.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 5),
             (char **)uVar1._M_t.
                      super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t
                      .super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                      super__Head_base<0UL,_const_char_**,_false>._M_head_impl,(char **)0x0,
             (unordered_set *)local_278);
  std::
  _Hashtable<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_278);
  lVar3 = jessilib::app_parameters::name_abi_cxx11_();
  bVar8 = *(long *)(lVar3 + 8) != 0;
  local_1e8[0] = bVar8;
  local_1e8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar8) {
    testing::Message::Message((Message *)&local_218);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_278,local_1e8,"parameters.name().empty()","true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0xde,(char *)local_278);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a0,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a0);
    if (local_278 != (undefined1  [8])&local_268) {
      operator_delete((void *)local_278,local_268._M_allocated_capacity + 1);
    }
    if ((long *)local_218._M_impl._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_218._M_impl._0_8_ + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_1e8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_1e8._8_8_);
    }
  }
  plVar4 = (long *)jessilib::app_parameters::arguments_abi_cxx11_();
  local_1e8._0_8_ = plVar4[1] - *plVar4 >> 5;
  local_218._M_impl._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_278,"parameters.arguments().size()","2U",(unsigned_long *)local_1e8,
             (uint *)&local_218);
  if (local_278[0] == (unordered_set)0x0) {
    testing::Message::Message((Message *)local_1e8);
    if (local_270._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_270._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0xdf,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_218,(Message *)local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
    if ((void *)local_1e8._0_8_ != (void *)0x0) {
      (**(code **)(*(long *)local_1e8._0_8_ + 8))();
    }
  }
  if (local_270._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_270,local_270._M_head_impl);
  }
  plVar4 = (long *)jessilib::app_parameters::switches();
  local_1e8._0_8_ = plVar4[1] - *plVar4 >> 4;
  local_218._M_impl._0_8_ = local_218._M_impl._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_278,"parameters.switches().size()","0U",(unsigned_long *)local_1e8,
             (uint *)&local_218);
  if (local_278[0] == (unordered_set)0x0) {
    testing::Message::Message((Message *)local_1e8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_270._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_270._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0xe0,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_218,(Message *)local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
    if ((void *)local_1e8._0_8_ != (void *)0x0) {
      (**(code **)(*(long *)local_1e8._0_8_ + 8))();
    }
  }
  if (local_270._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_270,local_270._M_head_impl);
  }
  lVar3 = jessilib::app_parameters::switches_set();
  local_1e8._0_8_ = *(undefined8 *)(lVar3 + 0x18);
  local_218._M_impl._0_8_ = local_218._M_impl._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_278,"parameters.switches_set().size()","0U",
             (unsigned_long *)local_1e8,(uint *)&local_218);
  if (local_278[0] == (unordered_set)0x0) {
    testing::Message::Message((Message *)local_1e8);
    if (local_270._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_270._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0xe1,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_218,(Message *)local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
    if ((void *)local_1e8._0_8_ != (void *)0x0) {
      (**(code **)(*(long *)local_1e8._0_8_ + 8))();
    }
  }
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_270._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_270,local_270._M_head_impl);
  }
  jessilib::app_parameters::values();
  local_218._M_impl._0_8_ = local_268._8_8_;
  local_1a0.
  super__Vector_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_1e8,"parameters.values().size()","1U",(unsigned_long *)&local_218,
             (uint *)&local_1a0);
  std::
  _Hashtable<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_278);
  if ((bool)local_1e8[0] == false) {
    testing::Message::Message((Message *)local_278);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_1e8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0xe2,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_218,(Message *)local_278);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
    if (local_278 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_278 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_1e8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1e8._8_8_);
  }
  jessilib::app_parameters::as_object();
  local_278 = (undefined1  [8])&local_268;
  std::__cxx11::u8string::_M_construct<char8_t_const*>((u8string *)local_278,"-key=valuePart1","");
  _Var6._M_storage = (void *)((long)&local_258 + 0x10);
  local_258._M_first._M_storage = (_Uninitialized<void_*,_true>)_Var6._M_storage;
  std::__cxx11::u8string::_M_construct<char8_t_const*>((u8string *)&local_258,"valuePart2","");
  __l._M_len = 2;
  __l._M_array = (iterator)local_278;
  std::
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::vector(&local_1a0,__l,(allocator_type *)&local_218);
  lVar3 = -0x40;
  do {
    if ((long *)_Var6._M_storage != *(long **)((long)_Var6._M_storage + -0x10)) {
      operator_delete(*(long **)((long)_Var6._M_storage + -0x10),*_Var6._M_storage + 1);
    }
    _Var6._M_storage = _Var6._M_storage + -0x20;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0);
  std::
  pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>
  ::pair<const_char8_t_(&)[4],_const_char8_t_(&)[22],_true>
            ((pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>
              *)local_278,(char8_t (*) [4])0x476187,(char8_t (*) [22])"valuePart1 valuePart2");
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_278;
  std::
  map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
  ::map((map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
         *)&local_218,__l_00,local_288,(allocator_type *)&local_290);
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_258._M_first);
  if (local_278 != (undefined1  [8])&local_268) {
    operator_delete((void *)local_278,local_268._M_allocated_capacity + 1);
  }
  bVar2 = jessilib::object::null();
  local_288[0] = (less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
                  )(bVar2 ^ 1);
  local_280 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2 != 0) {
    testing::Message::Message((Message *)&local_290);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_278,(char *)local_288,"obj.null()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0xe7,(char *)local_278);
    testing::internal::AssertHelper::operator=(local_1a8,(Message *)&local_290);
    testing::internal::AssertHelper::~AssertHelper(local_1a8);
    if (local_278 != (undefined1  [8])&local_268) {
      operator_delete((void *)local_278,local_268._M_allocated_capacity + 1);
    }
    if (local_290 != (long *)0x0) {
      (**(code **)(*local_290 + 8))();
    }
    if (local_280 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_280,local_280);
    }
  }
  local_278 = (undefined1  [8])&local_268;
  std::__cxx11::u8string::_M_construct<char8_t_const*>((u8string *)local_278,"Name","");
  poVar5 = (object *)jessilib::object::operator[]((u8string *)local_1e8);
  testing::internal::CmpHelperEQ<jessilib::object,char8_t[13]>
            ((internal *)local_288,"obj[u8\"Name\"]","u8\"/path/to/exe\"",poVar5,
             (char8_t (*) [13])"/path/to/exe");
  if (local_278 != (undefined1  [8])&local_268) {
    operator_delete((void *)local_278,local_268._M_allocated_capacity + 1);
  }
  if (local_288[0] ==
      (less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
       )0x0) {
    testing::Message::Message((Message *)local_278);
    if (local_280 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_280->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0xe8,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_290,(Message *)local_278);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_290);
    if (local_278 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_278 + 8))();
    }
  }
  if (local_280 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_280,local_280);
  }
  local_278 = (undefined1  [8])&local_268;
  std::__cxx11::u8string::_M_construct<char8_t_const*>((u8string *)local_278,"Args","");
  poVar5 = (object *)jessilib::object::operator[]((u8string *)local_1e8);
  testing::internal::
  CmpHelperEQ<jessilib::object,std::vector<std::__cxx11::u8string,std::allocator<std::__cxx11::u8string>>>
            ((internal *)local_288,"obj[u8\"Args\"]","expected_args",poVar5,&local_1a0);
  if (local_278 != (undefined1  [8])&local_268) {
    operator_delete((void *)local_278,local_268._M_allocated_capacity + 1);
  }
  if (local_288[0] ==
      (less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
       )0x0) {
    testing::Message::Message((Message *)local_278);
    if (local_280 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_280->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0xe9,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_290,(Message *)local_278);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_290);
    if (local_278 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_278 + 8))();
    }
  }
  if (local_280 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_280,local_280);
  }
  local_278 = (undefined1  [8])&local_268;
  std::__cxx11::u8string::_M_construct<char8_t_const*>((u8string *)local_278,"Values","");
  poVar5 = (object *)jessilib::object::operator[]((u8string *)local_1e8);
  testing::internal::
  CmpHelperEQ<jessilib::object,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
            ((internal *)local_288,"obj[u8\"Values\"]","expected_values",poVar5,
             (map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
              *)&local_218);
  if (local_278 != (undefined1  [8])&local_268) {
    operator_delete((void *)local_278,local_268._M_allocated_capacity + 1);
  }
  if (local_288[0] ==
      (less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
       )0x0) {
    testing::Message::Message((Message *)local_278);
    if (local_280 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_280->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0xea,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_290,(Message *)local_278);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_290);
    if (local_278 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_278 + 8))();
    }
  }
  if (local_280 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_280,local_280);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
  ::~_Rb_tree(&local_218);
  std::
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~vector(&local_1a0);
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)local_1e8);
  jessilib::app_parameters::~app_parameters(local_168);
  if ((tuple<const_char_**,_std::default_delete<const_char_*[]>_>)
      local_188.m_argv._M_t.
      super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
      super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
      super__Head_base<0UL,_const_char_**,_false>._M_head_impl !=
      (_Head_base<0UL,_const_char_**,_false>)0x0) {
    operator_delete__((void *)local_188.m_argv._M_t.
                              super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>
                              .super__Head_base<0UL,_const_char_**,_false>._M_head_impl);
  }
  local_188.m_argv._M_t.super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>.
  _M_t.super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
  super__Head_base<0UL,_const_char_**,_false>._M_head_impl =
       (__uniq_ptr_data<const_char_*,_std::default_delete<const_char_*[]>,_true,_true>)
       (__uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_188.m_args);
  return;
}

Assistant:

TEST(AppParametersTest, multiword_value_eq) {
	ArgWrapper args{ "/path/to/exe", "-key=valuePart1", "valuePart2" };
	app_parameters parameters{ args.argc(), args.argv() };

	EXPECT_FALSE(parameters.name().empty());
	EXPECT_EQ(parameters.arguments().size(), 2U);
	EXPECT_EQ(parameters.switches().size(), 0U);
	EXPECT_EQ(parameters.switches_set().size(), 0U);
	EXPECT_EQ(parameters.values().size(), 1U);

	auto obj = parameters.as_object();
	std::vector<std::u8string> expected_args{ u8"-key=valuePart1", u8"valuePart2" };
	std::map<std::u8string, object> expected_values{ { u8"key", u8"valuePart1 valuePart2" } };
	EXPECT_FALSE(obj.null());
	EXPECT_EQ(obj[u8"Name"], u8"/path/to/exe");
	EXPECT_EQ(obj[u8"Args"], expected_args);
	EXPECT_EQ(obj[u8"Values"], expected_values);
}